

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_stdout_and_stderr_to_file_swap(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  uv_loop_t *puVar6;
  int64_t iVar7;
  undefined8 uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  int64_t eval_b_4;
  int64_t eval_b_8;
  int64_t eval_b;
  ulong local_220;
  uv_stdio_container_t stdio [3];
  uv_fs_t fs_req;
  
  local_220 = eval_b;
  unlink("stdout_file");
  unlink("stderr_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar3 = uv_fs_open((uv_loop_t *)0x0,&fs_req,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  iVar4 = (int)fs_req.result;
  stdio[0]._0_8_ = SEXT48(iVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_220;
  _eval_b = (uv_buf_t)(auVar2 << 0x40);
  if (stdio[0]._0_8_ == 0) {
    uv_fs_req_cleanup(&fs_req);
    iVar4 = dup2(iVar4,1);
    stdio[0]._0_8_ = SEXT48(iVar4);
    eval_b = -1;
    if (stdio[0]._0_8_ == -1) {
      pcVar10 = "!=";
      pcVar11 = "-1";
      pcVar9 = "stdout_file";
      uVar8 = 0x209;
      stdio[0].flags = ~UV_IGNORE;
      stdio[0]._4_4_ = 0xffffffff;
    }
    else {
      iVar3 = uv_fs_open((uv_loop_t *)0x0,&fs_req,"stderr_file",0x42,0x180,(uv_fs_cb)0x0);
      stdio[0]._0_8_ = SEXT48(iVar3);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_220;
      _eval_b = (uv_buf_t)(auVar1 << 0x40);
      if (stdio[0]._0_8_ == 0) {
        uv_fs_req_cleanup(&fs_req);
        iVar3 = dup2((int)fs_req.result,2);
        eval_b = -1;
        if (iVar3 != -1) {
          options.stdio = stdio;
          stdio[0]._4_4_ = iVar3 >> 0x1f;
          stdio[0]._0_8_ = (ulong)(uint)stdio[0]._4_4_ << 0x20;
          options.stdio_count = 3;
          stdio[1].flags = UV_INHERIT_FD;
          stdio[1].data._0_4_ = iVar3;
          stdio[2].flags = UV_INHERIT_FD;
          stdio[2].data._0_4_ = iVar4;
          puVar6 = uv_default_loop();
          iVar5 = uv_spawn(puVar6,&process,&options);
          eval_b = (int64_t)(long)iVar5;
          eval_b_4 = 0;
          if ((char *)(long)iVar5 == (char *)0x0) {
            puVar6 = uv_default_loop();
            iVar5 = uv_run(puVar6,UV_RUN_DEFAULT);
            eval_b = (int64_t)(long)iVar5;
            eval_b_4 = 0;
            if ((char *)(long)iVar5 == (char *)0x0) {
              eval_b = 1;
              eval_b_4 = (int64_t)exit_cb_called;
              if (eval_b_4 == 1) {
                eval_b = 1;
                eval_b_4 = (int64_t)close_cb_called;
                if (eval_b_4 == 1) {
                  _eval_b = uv_buf_init(output,0x400);
                  iVar5 = uv_fs_read((uv_loop_t *)0x0,&fs_req,iVar4,(uv_buf_t *)&eval_b,1,0,
                                     (uv_fs_cb)0x0);
                  iVar7 = (int64_t)iVar5;
                  eval_b_8 = 0xf;
                  if (iVar7 < 0xf) {
                    pcVar10 = ">=";
                    pcVar11 = "15";
                    pcVar9 = "r";
                    uVar8 = 0x22b;
                  }
                  else {
                    uv_fs_req_cleanup(&fs_req);
                    iVar4 = uv_fs_close((uv_loop_t *)0x0,&fs_req,iVar4,(uv_fs_cb)0x0);
                    iVar7 = (int64_t)iVar4;
                    eval_b_8 = 0;
                    if (iVar7 == 0) {
                      uv_fs_req_cleanup(&fs_req);
                      printf("output is: %s",output);
                      iVar4 = strncmp("hello errworld\n",output,0xf);
                      iVar7 = (int64_t)iVar4;
                      eval_b_8 = 0;
                      if (iVar7 == 0) {
                        iVar4 = uv_fs_read((uv_loop_t *)0x0,&fs_req,iVar3,(uv_buf_t *)&eval_b,1,0,
                                           (uv_fs_cb)0x0);
                        iVar7 = (int64_t)iVar4;
                        eval_b_8 = 0xc;
                        if (iVar7 < 0xc) {
                          pcVar10 = ">=";
                          pcVar11 = "12";
                          pcVar9 = "r";
                          uVar8 = 0x237;
                        }
                        else {
                          uv_fs_req_cleanup(&fs_req);
                          iVar4 = uv_fs_close((uv_loop_t *)0x0,&fs_req,iVar3,(uv_fs_cb)0x0);
                          iVar7 = (int64_t)iVar4;
                          eval_b_8 = 0;
                          if (iVar7 == 0) {
                            uv_fs_req_cleanup(&fs_req);
                            printf("output is: %s",output);
                            iVar4 = strncmp("hello world\n",output,0xc);
                            iVar7 = (int64_t)iVar4;
                            eval_b_8 = 0;
                            if (iVar7 == 0) {
                              unlink("stdout_file");
                              unlink("stderr_file");
                              puVar6 = uv_default_loop();
                              close_loop(puVar6);
                              eval_b_4 = 0;
                              puVar6 = uv_default_loop();
                              iVar4 = uv_loop_close(puVar6);
                              eval_b_8 = (int64_t)iVar4;
                              if (eval_b_8 == 0) {
                                uv_library_shutdown();
                                return 0;
                              }
                              pcVar10 = "==";
                              pcVar11 = "uv_loop_close(uv_default_loop())";
                              pcVar9 = "0";
                              uVar8 = 0x245;
                              iVar7 = eval_b_4;
                            }
                            else {
                              pcVar10 = "==";
                              pcVar11 = "0";
                              pcVar9 = "strncmp(\"hello world\\n\", output, 12)";
                              uVar8 = 0x23f;
                            }
                          }
                          else {
                            pcVar10 = "==";
                            pcVar11 = "0";
                            pcVar9 = "r";
                            uVar8 = 0x23b;
                          }
                        }
                      }
                      else {
                        pcVar10 = "==";
                        pcVar11 = "0";
                        pcVar9 = "strncmp(\"hello errworld\\n\", output, 15)";
                        uVar8 = 0x233;
                      }
                    }
                    else {
                      pcVar10 = "==";
                      pcVar11 = "0";
                      pcVar9 = "r";
                      uVar8 = 0x22f;
                    }
                  }
                  goto LAB_00173fdf;
                }
                pcVar11 = "close_cb_called";
                pcVar9 = "1";
                uVar8 = 0x225;
              }
              else {
                pcVar11 = "exit_cb_called";
                pcVar9 = "1";
                uVar8 = 0x224;
              }
            }
            else {
              pcVar11 = "0";
              pcVar9 = "r";
              uVar8 = 0x222;
            }
          }
          else {
            pcVar11 = "0";
            pcVar9 = "r";
            uVar8 = 0x21f;
          }
          pcVar10 = "==";
          iVar7 = eval_b;
          eval_b_8 = eval_b_4;
          goto LAB_00173fdf;
        }
        pcVar10 = "!=";
        pcVar11 = "-1";
        pcVar9 = "stderr_file";
        uVar8 = 0x212;
        stdio[0].flags = ~UV_IGNORE;
        stdio[0]._4_4_ = 0xffffffff;
      }
      else {
        pcVar10 = "==";
        pcVar11 = "0";
        pcVar9 = "r";
        uVar8 = 0x20e;
      }
    }
  }
  else {
    pcVar10 = "==";
    pcVar11 = "0";
    pcVar9 = "r";
    uVar8 = 0x205;
  }
  iVar7 = stdio[0]._0_8_;
  eval_b_8 = eval_b;
LAB_00173fdf:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar8,pcVar9,pcVar10,pcVar11,iVar7,pcVar10,eval_b_8);
  abort();
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file_swap) {
#ifndef _WIN32
  int r;
  uv_os_fd_t stdout_file;
  uv_os_fd_t stderr_file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");
  unlink("stderr_file");

  init_process_options("spawn_helper6", exit_cb);

  /* open 'stdout_file' and replace STDOUT_FILENO with it */
  r = uv_fs_open(NULL,
                 &fs_req,
                 "stdout_file",
                 O_CREAT | O_RDWR,
                 S_IRUSR | S_IWUSR,
                 NULL);
  ASSERT_OK(r);
  stdout_file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);
  stdout_file = dup2(stdout_file, STDOUT_FILENO);
  ASSERT_NE(stdout_file, -1);

  /* open 'stderr_file' and replace STDERR_FILENO with it */
  r = uv_fs_open(NULL, &fs_req, "stderr_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT_OK(r);
  stderr_file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);
  stderr_file = dup2(stderr_file, STDERR_FILENO);
  ASSERT_NE(stderr_file, -1);

  /* now we're going to swap them: the child process' stdout will be our
   * stderr_file and vice versa */
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.file = stderr_file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.file = stdout_file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  buf = uv_buf_init(output, sizeof(output));

  /* check the content of stdout_file */
  r = uv_fs_read(NULL, &fs_req, stdout_file, &buf, 1, 0, NULL);
  ASSERT_GE(r, 15);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stdout_file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strncmp("hello errworld\n", output, 15));

  /* check the content of stderr_file */
  r = uv_fs_read(NULL, &fs_req, stderr_file, &buf, 1, 0, NULL);
  ASSERT_GE(r, 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stderr_file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strncmp("hello world\n", output, 12));

  /* Cleanup. */
  unlink("stdout_file");
  unlink("stderr_file");

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}